

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmAddLibraryCommand.cxx
# Opt level: O3

bool cmAddLibraryCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  pointer pcVar2;
  byte bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  PolicyStatus PVar8;
  cmValue cVar9;
  undefined8 uVar10;
  string *extraout_RAX;
  string *psVar11;
  undefined7 extraout_var;
  cmState *this;
  long lVar12;
  cmTarget *pcVar13;
  string *psVar14;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  TargetType TVar15;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view value;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  srcs;
  undefined1 local_e8 [16];
  string local_d8;
  undefined1 local_b8 [16];
  undefined1 local_a8 [32];
  undefined8 local_88;
  char *local_80;
  uint local_74;
  byte local_6d;
  uint local_6c;
  uint local_68;
  uint local_64;
  string *local_60;
  string local_58;
  cmMakefile *local_38;
  
  if ((args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start ==
      (args->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_b8._0_8_ = (string *)local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    local_d8._M_dataplus._M_p = (pointer)local_a8._0_8_;
    local_58._M_dataplus._M_p = (pointer)local_b8._0_8_;
    if ((string *)local_b8._0_8_ == (string *)local_a8) {
      return false;
    }
    goto LAB_002298ae;
  }
  pcVar1 = status->Makefile;
  local_b8._0_8_ = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_b8,"BUILD_SHARED_LIBS","");
  cVar9 = cmMakefile::GetDefinition(pcVar1,(string *)local_b8);
  if (cVar9.Value == (string *)0x0) {
    TVar15 = STATIC_LIBRARY;
  }
  else {
    value._M_str = ((cVar9.Value)->_M_dataplus)._M_p;
    value._M_len = (cVar9.Value)->_M_string_length;
    bVar4 = cmValue::IsOff(value);
    TVar15 = SHARED_LIBRARY - bVar4;
  }
  local_38 = pcVar1;
  if ((string *)local_b8._0_8_ != (string *)local_a8) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
  }
  psVar11 = (args->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  __first._M_current = psVar11 + 1;
  psVar14 = &status->Error;
  local_6c = 0;
  local_74 = 0;
  bVar4 = false;
  local_64 = 0;
  local_68 = 0;
  local_60 = psVar11;
  do {
    if (__first._M_current ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) goto LAB_002291cb;
    local_b8._0_8_ = local_a8;
    pcVar2 = ((__first._M_current)->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_b8,pcVar2,pcVar2 + (__first._M_current)->_M_string_length);
    iVar6 = std::__cxx11::string::compare((char *)local_b8);
    if (iVar6 == 0) {
      if (TVar15 != INTERFACE_LIBRARY) {
        TVar15 = STATIC_LIBRARY;
        goto LAB_00229085;
      }
      local_e8._0_8_ = &local_d8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_e8,"INTERFACE library specified with conflicting STATIC type.","");
      std::__cxx11::string::_M_assign((string *)psVar14);
LAB_00229051:
      if ((string *)local_e8._0_8_ != &local_d8) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_dataplus._M_p + 1));
      }
      TVar15 = INTERFACE_LIBRARY;
LAB_00229073:
      iVar6 = 1;
    }
    else {
      iVar6 = std::__cxx11::string::compare((char *)local_b8);
      if (iVar6 == 0) {
        if (TVar15 == INTERFACE_LIBRARY) {
          local_e8._0_8_ = &local_d8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_e8,"INTERFACE library specified with conflicting SHARED type.",
                     "");
          std::__cxx11::string::_M_assign((string *)psVar14);
          goto LAB_00229051;
        }
        TVar15 = SHARED_LIBRARY;
      }
      else {
        iVar6 = std::__cxx11::string::compare((char *)local_b8);
        if (iVar6 == 0) {
          if (TVar15 == INTERFACE_LIBRARY) {
            local_e8._0_8_ = &local_d8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_e8,
                       "INTERFACE library specified with conflicting MODULE type.","");
            std::__cxx11::string::_M_assign((string *)psVar14);
            goto LAB_00229051;
          }
          TVar15 = MODULE_LIBRARY;
        }
        else {
          iVar6 = std::__cxx11::string::compare((char *)local_b8);
          if (iVar6 == 0) {
            if (TVar15 == INTERFACE_LIBRARY) {
              local_e8._0_8_ = &local_d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_e8,
                         "INTERFACE library specified with conflicting OBJECT type.","");
              std::__cxx11::string::_M_assign((string *)psVar14);
              goto LAB_00229051;
            }
            TVar15 = OBJECT_LIBRARY;
          }
          else {
            iVar6 = std::__cxx11::string::compare((char *)local_b8);
            if (iVar6 != 0) {
              uVar10 = std::__cxx11::string::compare((char *)local_b8);
              if ((int)uVar10 == 0) {
                if (TVar15 == INTERFACE_LIBRARY) {
                  local_e8._0_8_ = &local_d8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_e8,
                             "INTERFACE library specified with conflicting ALIAS type.","");
                  std::__cxx11::string::_M_assign((string *)psVar14);
                  goto LAB_00229051;
                }
                __first._M_current = __first._M_current + 1;
                iVar6 = 0;
                local_64 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
              }
              else {
                iVar6 = std::__cxx11::string::compare((char *)local_b8);
                if (iVar6 == 0) {
                  if (bVar4) {
                    local_e8._0_8_ = &local_d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_e8,
                               "INTERFACE library specified with conflicting/multiple types.","");
                    std::__cxx11::string::_M_assign((string *)psVar14);
                  }
                  else {
                    if ((local_64 & 1) == 0) {
                      TVar15 = INTERFACE_LIBRARY;
                      goto LAB_00229085;
                    }
                    local_e8._0_8_ = &local_d8;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_e8,
                               "INTERFACE library specified with conflicting ALIAS type.","");
                    std::__cxx11::string::_M_assign((string *)psVar14);
                  }
LAB_00229152:
                  if ((string *)local_e8._0_8_ != &local_d8) {
                    operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_dataplus._M_p + 1));
                  }
                  goto LAB_00229073;
                }
                uVar10 = std::__cxx11::string::compare((char *)__first._M_current);
                if ((int)uVar10 == 0) {
                  __first._M_current = __first._M_current + 1;
                  local_68 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
                  iVar6 = 0;
                }
                else {
                  uVar10 = std::__cxx11::string::compare((char *)__first._M_current);
                  if ((int)uVar10 == 0) {
                    __first._M_current = __first._M_current + 1;
                    iVar6 = 0;
                    local_74 = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
                  }
                  else if (((local_74 & 1) == 0) ||
                          (uVar10 = std::__cxx11::string::compare((char *)__first._M_current),
                          (int)uVar10 != 0)) {
                    iVar6 = 3;
                    if (TVar15 == INTERFACE_LIBRARY) {
                      iVar7 = std::__cxx11::string::compare((char *)__first._M_current);
                      TVar15 = INTERFACE_LIBRARY;
                      if (iVar7 == 0) {
                        local_e8._0_8_ = &local_d8;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)local_e8,
                                   "GLOBAL option may only be used with IMPORTED libraries.","");
                        std::__cxx11::string::_M_assign((string *)psVar14);
                        goto LAB_00229152;
                      }
                    }
                  }
                  else {
                    __first._M_current = __first._M_current + 1;
                    iVar6 = 0;
                    local_6c = (uint)CONCAT71((int7)((ulong)uVar10 >> 8),1);
                  }
                }
              }
              goto LAB_0022908e;
            }
            if (TVar15 == INTERFACE_LIBRARY) {
              local_e8._0_8_ = &local_d8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_e8,
                         "INTERFACE library specified with conflicting UNKNOWN type.","");
              std::__cxx11::string::_M_assign((string *)psVar14);
              goto LAB_00229051;
            }
            TVar15 = UNKNOWN_LIBRARY;
          }
        }
      }
LAB_00229085:
      __first._M_current = __first._M_current + 1;
      iVar6 = 0;
      bVar4 = true;
    }
LAB_0022908e:
    psVar11 = (string *)local_a8;
    if ((string *)local_b8._0_8_ != psVar11) {
      operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
      psVar11 = extraout_RAX;
    }
  } while (iVar6 == 0);
  if (iVar6 != 3) {
    return false;
  }
LAB_002291cb:
  pcVar1 = local_38;
  if ((local_74 & 1) == 0) {
    bVar3 = (byte)local_6c;
    if ((TVar15 == INTERFACE_LIBRARY & (byte)local_6c) != 1) goto LAB_0022923e;
    local_b8._0_8_ = local_a8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_b8,"INTERFACE library specified as GLOBAL, but not as IMPORTED.","");
    std::__cxx11::string::_M_assign((string *)psVar14);
    goto LAB_0022989a;
  }
  bVar3 = 1;
  if ((local_6c & 1) == 0) {
    bVar5 = cmMakefile::IsImportedTargetGlobalScope(local_38);
    local_6c = (uint)CONCAT71(extraout_var,bVar5);
  }
  else {
    local_6c = (uint)CONCAT71((int7)((ulong)psVar11 >> 8),1);
  }
LAB_0022923e:
  local_6d = bVar3;
  psVar11 = local_60;
  bVar5 = cmGeneratorExpression::IsValidTargetName(local_60);
  if (bVar5) {
    bVar5 = cmGlobalGenerator::IsReservedTarget(psVar11);
    psVar11 = local_60;
    if ((bVar5 || (local_74 & 1) != 0) || ((local_64 & 1) != 0)) {
      if (bVar5) goto LAB_002292a5;
    }
    else {
      lVar12 = std::__cxx11::string::find((char)local_60,0x3a);
      if (lVar12 != -1) goto LAB_002292a5;
    }
  }
  else {
LAB_002292a5:
    bVar5 = cmMakefile::CheckCMP0037(pcVar1,psVar11,TVar15);
    if (!bVar5) {
      return false;
    }
  }
  psVar11 = local_60;
  if ((local_64 & 1) == 0) {
    if (((local_74 & 1) != 0) && ((local_68 & 1) != 0)) {
      local_b8._0_8_ = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"excludeFromAll with IMPORTED target makes no sense.","");
      std::__cxx11::string::_M_assign((string *)psVar14);
      goto LAB_0022989a;
    }
    if ((TVar15 & ~STATIC_LIBRARY) == SHARED_LIBRARY) {
      this = cmMakefile::GetState(pcVar1);
      local_b8._0_8_ = local_a8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_b8,"TARGET_SUPPORTS_SHARED_LIBS","");
      bVar5 = cmState::GetGlobalPropertyAsBool(this,(string *)local_b8);
      if ((string *)local_b8._0_8_ != (string *)local_a8) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
      }
      if (bVar5) goto LAB_002293d0;
      local_a8._8_8_ = "MODULE";
      if (TVar15 == SHARED_LIBRARY) {
        local_a8._8_8_ = "SHARED";
      }
      local_b8._0_8_ = (string *)0x18;
      local_b8._8_8_ = "ADD_LIBRARY called with ";
      local_a8._0_8_ = (pointer)0x6;
      local_a8._16_8_ = 0x42;
      local_a8._24_8_ = " option but the target platform does not support dynamic linking. ";
      local_88 = 0x3d;
      local_80 = "Building a STATIC library instead. This may lead to problems.";
      views_00._M_len = 4;
      views_00._M_array = (iterator)local_b8;
      cmCatViews_abi_cxx11_((string *)local_e8,views_00);
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,(string *)local_e8);
      psVar11 = local_60;
      if ((string *)local_e8._0_8_ != &local_d8) {
        operator_delete((void *)local_e8._0_8_,(ulong)(local_d8._M_dataplus._M_p + 1));
      }
      TVar15 = STATIC_LIBRARY;
      if ((local_74 & 1) != 0) {
        if (bVar4) goto LAB_002295eb;
LAB_00229751:
        local_b8._0_8_ = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"called with IMPORTED argument but no library type.","");
        std::__cxx11::string::_M_assign((string *)psVar14);
        goto LAB_0022989a;
      }
LAB_00229670:
      local_b8._0_8_ = local_a8;
      local_b8._8_8_ = (pointer)0x0;
      local_a8._0_8_ = local_a8._0_8_ & 0xffffffffffffff00;
      bVar4 = cmMakefile::EnforceUniqueName(pcVar1,psVar11,(string *)local_b8,false);
      if (!bVar4) {
        std::__cxx11::string::_M_assign((string *)psVar14);
        goto LAB_0022989a;
      }
      if ((string *)local_b8._0_8_ != (string *)local_a8) {
        operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
      }
      if ((TVar15 != INTERFACE_LIBRARY) ||
         ((bVar4 = cmGeneratorExpression::IsValidTargetName(psVar11), bVar4 &&
          (lVar12 = std::__cxx11::string::find((char *)psVar11,0x7dded6,0), lVar12 == -1)))) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_b8,
                   __first,(args->
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish,(allocator_type *)local_e8);
        cmMakefile::AddLibrary
                  (pcVar1,psVar11,TVar15,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_b8,(bool)((byte)local_68 & 1));
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_b8);
        return true;
      }
      local_a8._8_8_ = (psVar11->_M_dataplus)._M_p;
      local_a8._0_8_ = psVar11->_M_string_length;
      local_b8._0_8_ = &DAT_0000002b;
      local_b8._8_8_ = "Invalid name for INTERFACE library target: ";
      views_01._M_len = 2;
      views_01._M_array = (iterator)local_b8;
      cmCatViews_abi_cxx11_((string *)local_e8,views_01);
      std::__cxx11::string::_M_assign((string *)psVar14);
    }
    else {
LAB_002293d0:
      psVar11 = local_60;
      if ((local_74 & 1) == 0) {
        if (TVar15 == UNKNOWN_LIBRARY) {
          local_b8._0_8_ = local_a8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_b8,
                     "The UNKNOWN library type may be used only for IMPORTED libraries.","");
          cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,(string *)local_b8);
          if ((undefined1 *)local_b8._0_8_ == local_a8) {
            return true;
          }
          operator_delete((void *)local_b8._0_8_,(ulong)(local_a8._0_8_ + 1));
          return true;
        }
        goto LAB_00229670;
      }
      if (!bVar4) goto LAB_00229751;
      if (TVar15 != INTERFACE_LIBRARY) {
LAB_002295eb:
        pcVar13 = cmMakefile::FindTargetToUse(pcVar1,psVar11,false);
        if (pcVar13 == (cmTarget *)0x0) {
          cmMakefile::AddImportedTarget(pcVar1,psVar11,TVar15,(bool)((byte)local_6c & 1));
          return true;
        }
        local_b8._0_8_ = (string *)0x1f;
        local_b8._8_8_ = "cannot create imported target \"";
        local_e8._8_8_ = (psVar11->_M_dataplus)._M_p;
        local_e8._0_8_ = psVar11->_M_string_length;
        cmStrCat<char[60]>(&local_58,(cmAlphaNum *)local_b8,(cmAlphaNum *)local_e8,
                           (char (*) [60])
                           "\" because another target with the same name already exists.");
        std::__cxx11::string::_M_assign((string *)psVar14);
        goto LAB_0022964e;
      }
      bVar4 = cmGeneratorExpression::IsValidTargetName(local_60);
      TVar15 = INTERFACE_LIBRARY;
      if (bVar4) goto LAB_002295eb;
      local_a8._8_8_ = (psVar11->_M_dataplus)._M_p;
      local_a8._0_8_ = psVar11->_M_string_length;
      local_b8._0_8_ = (string *)0x34;
      local_b8._8_8_ = "Invalid name for IMPORTED INTERFACE library target: ";
      views._M_len = 2;
      views._M_array = (iterator)local_b8;
      cmCatViews_abi_cxx11_((string *)local_e8,views);
      std::__cxx11::string::_M_assign((string *)psVar14);
    }
    local_58._M_dataplus._M_p = (pointer)local_e8._0_8_;
    if ((string *)local_e8._0_8_ == &local_d8) {
      return false;
    }
  }
  else {
    bVar4 = cmGeneratorExpression::IsValidTargetName(local_60);
    if (bVar4) {
      if ((local_68 & 1) == 0) {
        if ((local_6d & 1) == 0) {
          if ((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start != 0x60) {
            local_b8._0_8_ = local_a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_b8,"ALIAS requires exactly one target argument.","");
            std::__cxx11::string::_M_assign((string *)psVar14);
            goto LAB_0022989a;
          }
          PVar8 = cmMakefile::GetPolicyStatus(pcVar1,CMP0107,false);
          psVar11 = local_60;
          if ((PVar8 == NEW) &&
             (pcVar13 = cmMakefile::FindTargetToUse(pcVar1,local_60,false),
             pcVar13 != (cmTarget *)0x0)) {
            local_b8._0_8_ = (string *)0x1c;
            local_b8._8_8_ = "cannot create ALIAS target \"";
            local_e8._8_8_ = (psVar11->_M_dataplus)._M_p;
            local_e8._0_8_ = psVar11->_M_string_length;
            cmStrCat<char[60]>(&local_58,(cmAlphaNum *)local_b8,(cmAlphaNum *)local_e8,
                               (char (*) [60])
                               "\" because another target with the same name already exists.");
            std::__cxx11::string::_M_assign((string *)psVar14);
          }
          else {
            bVar4 = cmMakefile::IsAlias(pcVar1,__first._M_current);
            if (bVar4) {
              local_b8._0_8_ = (string *)0x1c;
              local_b8._8_8_ = "cannot create ALIAS target \"";
              local_e8._8_8_ = (psVar11->_M_dataplus)._M_p;
              local_e8._0_8_ = psVar11->_M_string_length;
              cmStrCat<char[19],std::__cxx11::string,char[22]>
                        (&local_58,(cmAlphaNum *)local_b8,(cmAlphaNum *)local_e8,
                         (char (*) [19])"\" because target \"",__first._M_current,
                         (char (*) [22])"\" is itself an ALIAS.");
              std::__cxx11::string::_M_assign((string *)psVar14);
            }
            else {
              pcVar13 = cmMakefile::FindTargetToUse(pcVar1,__first._M_current,true);
              if (pcVar13 == (cmTarget *)0x0) {
                local_b8._0_8_ = (string *)0x1c;
                local_b8._8_8_ = "cannot create ALIAS target \"";
                local_e8._8_8_ = (psVar11->_M_dataplus)._M_p;
                local_e8._0_8_ = psVar11->_M_string_length;
                cmStrCat<char[19],std::__cxx11::string,char[26]>
                          (&local_58,(cmAlphaNum *)local_b8,(cmAlphaNum *)local_e8,
                           (char (*) [19])"\" because target \"",__first._M_current,
                           (char (*) [26])"\" does not already exist.");
                std::__cxx11::string::_M_assign((string *)psVar14);
              }
              else {
                TVar15 = cmTarget::GetType(pcVar13);
                if (((TVar15 - STATIC_LIBRARY < 4) || (TVar15 == INTERFACE_LIBRARY)) ||
                   ((TVar15 == UNKNOWN_LIBRARY && (bVar4 = cmTarget::IsImported(pcVar13), bVar4))))
                {
                  bVar4 = cmTarget::IsImported(pcVar13);
                  bVar5 = true;
                  if (bVar4) {
                    bVar5 = cmTarget::IsImportedGloballyVisible(pcVar13);
                  }
                  cmMakefile::AddAlias(local_38,psVar11,__first._M_current,bVar5);
                  return true;
                }
                local_b8._0_8_ = (string *)0x1c;
                local_b8._8_8_ = "cannot create ALIAS target \"";
                local_e8._8_8_ = (psVar11->_M_dataplus)._M_p;
                local_e8._0_8_ = psVar11->_M_string_length;
                cmStrCat<char[19],std::__cxx11::string,char[20]>
                          (&local_58,(cmAlphaNum *)local_b8,(cmAlphaNum *)local_e8,
                           (char (*) [19])"\" because target \"",__first._M_current,
                           (char (*) [20])"\" is not a library.");
                std::__cxx11::string::_M_assign((string *)psVar14);
              }
            }
          }
LAB_0022964e:
          local_d8._M_dataplus._M_p = (pointer)local_58.field_2._M_allocated_capacity;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == &local_58.field_2) {
            return false;
          }
          goto LAB_002298ae;
        }
        local_b8._0_8_ = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"IMPORTED with ALIAS is not allowed.","");
        std::__cxx11::string::_M_assign((string *)psVar14);
      }
      else {
        local_b8._0_8_ = local_a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_b8,"EXCLUDE_FROM_ALL with ALIAS makes no sense.","");
        std::__cxx11::string::_M_assign((string *)psVar14);
      }
    }
    else {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
                     "Invalid name for ALIAS: ",psVar11);
      std::__cxx11::string::_M_assign((string *)psVar14);
    }
LAB_0022989a:
    local_d8._M_dataplus._M_p = (pointer)local_a8._0_8_;
    local_58._M_dataplus._M_p = (pointer)local_b8._0_8_;
    if ((string *)local_b8._0_8_ == (string *)local_a8) {
      return false;
    }
  }
LAB_002298ae:
  operator_delete(local_58._M_dataplus._M_p,(ulong)(local_d8._M_dataplus._M_p + 1));
  return false;
}

Assistant:

bool cmAddLibraryCommand(std::vector<std::string> const& args,
                         cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  cmMakefile& mf = status.GetMakefile();
  // Library type defaults to value of BUILD_SHARED_LIBS, if it exists,
  // otherwise it defaults to static library.
  cmStateEnums::TargetType type = cmStateEnums::SHARED_LIBRARY;
  if (cmIsOff(mf.GetDefinition("BUILD_SHARED_LIBS"))) {
    type = cmStateEnums::STATIC_LIBRARY;
  }
  bool excludeFromAll = false;
  bool importTarget = false;
  bool importGlobal = false;

  auto s = args.begin();

  std::string const& libName = *s;

  ++s;

  // If the second argument is "SHARED" or "STATIC", then it controls
  // the type of library.  Otherwise, it is treated as a source or
  // source list name. There may be two keyword arguments, check for them
  bool haveSpecifiedType = false;
  bool isAlias = false;
  while (s != args.end()) {
    std::string libType = *s;
    if (libType == "STATIC") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting STATIC type.");
        return false;
      }
      ++s;
      type = cmStateEnums::STATIC_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "SHARED") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting SHARED type.");
        return false;
      }
      ++s;
      type = cmStateEnums::SHARED_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "MODULE") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting MODULE type.");
        return false;
      }
      ++s;
      type = cmStateEnums::MODULE_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "OBJECT") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting OBJECT type.");
        return false;
      }
      ++s;
      type = cmStateEnums::OBJECT_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "UNKNOWN") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting UNKNOWN type.");
        return false;
      }
      ++s;
      type = cmStateEnums::UNKNOWN_LIBRARY;
      haveSpecifiedType = true;
    } else if (libType == "ALIAS") {
      if (type == cmStateEnums::INTERFACE_LIBRARY) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      isAlias = true;
    } else if (libType == "INTERFACE") {
      if (haveSpecifiedType) {
        status.SetError(
          "INTERFACE library specified with conflicting/multiple types.");
        return false;
      }
      if (isAlias) {
        status.SetError(
          "INTERFACE library specified with conflicting ALIAS type.");
        return false;
      }
      ++s;
      type = cmStateEnums::INTERFACE_LIBRARY;
      haveSpecifiedType = true;
    } else if (*s == "EXCLUDE_FROM_ALL") {
      ++s;
      excludeFromAll = true;
    } else if (*s == "IMPORTED") {
      ++s;
      importTarget = true;
    } else if (importTarget && *s == "GLOBAL") {
      ++s;
      importGlobal = true;
    } else if (type == cmStateEnums::INTERFACE_LIBRARY && *s == "GLOBAL") {
      status.SetError(
        "GLOBAL option may only be used with IMPORTED libraries.");
      return false;
    } else {
      break;
    }
  }

  if (importTarget && !importGlobal) {
    importGlobal = mf.IsImportedTargetGlobalScope();
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (importGlobal && !importTarget) {
      status.SetError(
        "INTERFACE library specified as GLOBAL, but not as IMPORTED.");
      return false;
    }
  }

  bool nameOk = cmGeneratorExpression::IsValidTargetName(libName) &&
    !cmGlobalGenerator::IsReservedTarget(libName);

  if (nameOk && !importTarget && !isAlias) {
    nameOk = libName.find(':') == std::string::npos;
  }
  if (!nameOk && !mf.CheckCMP0037(libName, type)) {
    return false;
  }

  if (isAlias) {
    if (!cmGeneratorExpression::IsValidTargetName(libName)) {
      status.SetError("Invalid name for ALIAS: " + libName);
      return false;
    }
    if (excludeFromAll) {
      status.SetError("EXCLUDE_FROM_ALL with ALIAS makes no sense.");
      return false;
    }
    if (importTarget || importGlobal) {
      status.SetError("IMPORTED with ALIAS is not allowed.");
      return false;
    }
    if (args.size() != 3) {
      status.SetError("ALIAS requires exactly one target argument.");
      return false;
    }

    if (mf.GetPolicyStatus(cmPolicies::CMP0107) == cmPolicies::NEW) {
      // Make sure the target does not already exist.
      if (mf.FindTargetToUse(libName)) {
        status.SetError(cmStrCat(
          "cannot create ALIAS target \"", libName,
          "\" because another target with the same name already exists."));
        return false;
      }
    }

    std::string const& aliasedName = *s;
    if (mf.IsAlias(aliasedName)) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is itself an ALIAS."));
      return false;
    }
    cmTarget* aliasedTarget = mf.FindTargetToUse(aliasedName, true);
    if (!aliasedTarget) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" does not already exist."));
      return false;
    }
    cmStateEnums::TargetType aliasedType = aliasedTarget->GetType();
    if (aliasedType != cmStateEnums::SHARED_LIBRARY &&
        aliasedType != cmStateEnums::STATIC_LIBRARY &&
        aliasedType != cmStateEnums::MODULE_LIBRARY &&
        aliasedType != cmStateEnums::OBJECT_LIBRARY &&
        aliasedType != cmStateEnums::INTERFACE_LIBRARY &&
        !(aliasedType == cmStateEnums::UNKNOWN_LIBRARY &&
          aliasedTarget->IsImported())) {
      status.SetError(cmStrCat("cannot create ALIAS target \"", libName,
                               "\" because target \"", aliasedName,
                               "\" is not a library."));
      return false;
    }
    mf.AddAlias(libName, aliasedName,
                !aliasedTarget->IsImported() ||
                  aliasedTarget->IsImportedGloballyVisible());
    return true;
  }

  if (importTarget && excludeFromAll) {
    status.SetError("excludeFromAll with IMPORTED target makes no sense.");
    return false;
  }

  /* ideally we should check whether for the linker language of the target
    CMAKE_${LANG}_CREATE_SHARED_LIBRARY is defined and if not default to
    STATIC. But at this point we know only the name of the target, but not
    yet its linker language. */
  if ((type == cmStateEnums::SHARED_LIBRARY ||
       type == cmStateEnums::MODULE_LIBRARY) &&
      !mf.GetState()->GetGlobalPropertyAsBool("TARGET_SUPPORTS_SHARED_LIBS")) {
    mf.IssueMessage(
      MessageType::AUTHOR_WARNING,
      cmStrCat(
        "ADD_LIBRARY called with ",
        (type == cmStateEnums::SHARED_LIBRARY ? "SHARED" : "MODULE"),
        " option but the target platform does not support dynamic linking. ",
        "Building a STATIC library instead. This may lead to problems."));
    type = cmStateEnums::STATIC_LIBRARY;
  }

  // Handle imported target creation.
  if (importTarget) {
    // The IMPORTED signature requires a type to be specified explicitly.
    if (!haveSpecifiedType) {
      status.SetError("called with IMPORTED argument but no library type.");
      return false;
    }
    if (type == cmStateEnums::INTERFACE_LIBRARY) {
      if (!cmGeneratorExpression::IsValidTargetName(libName)) {
        status.SetError(cmStrCat(
          "Invalid name for IMPORTED INTERFACE library target: ", libName));
        return false;
      }
    }

    // Make sure the target does not already exist.
    if (mf.FindTargetToUse(libName)) {
      status.SetError(cmStrCat(
        "cannot create imported target \"", libName,
        "\" because another target with the same name already exists."));
      return false;
    }

    // Create the imported target.
    mf.AddImportedTarget(libName, type, importGlobal);
    return true;
  }

  // A non-imported target may not have UNKNOWN type.
  if (type == cmStateEnums::UNKNOWN_LIBRARY) {
    mf.IssueMessage(
      MessageType::FATAL_ERROR,
      "The UNKNOWN library type may be used only for IMPORTED libraries.");
    return true;
  }

  // Enforce name uniqueness.
  {
    std::string msg;
    if (!mf.EnforceUniqueName(libName, msg)) {
      status.SetError(msg);
      return false;
    }
  }

  if (type == cmStateEnums::INTERFACE_LIBRARY) {
    if (!cmGeneratorExpression::IsValidTargetName(libName) ||
        libName.find("::") != std::string::npos) {
      status.SetError(
        cmStrCat("Invalid name for INTERFACE library target: ", libName));
      return false;
    }
  }

  std::vector<std::string> srcs(s, args.end());
  mf.AddLibrary(libName, type, srcs, excludeFromAll);

  return true;
}